

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QWindowSystemInterface::TouchPoint>::
emplace<QWindowSystemInterface::TouchPoint_const&>
          (QGenericArrayOps<QWindowSystemInterface::TouchPoint> *this,qsizetype i,TouchPoint *args)

{
  TouchPoint **ppTVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long lVar6;
  undefined8 *puVar7;
  TouchPoint *pTVar8;
  long in_FS_OFFSET;
  bool bVar9;
  byte bVar10;
  Inserter local_f0;
  TouchPoint tmp;
  
  bVar10 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).d;
  if ((pDVar4 != (Data *)0x0) &&
     ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).size == i) {
      qVar5 = QArrayDataPointer<QWindowSystemInterface::TouchPoint>::freeSpaceAtEnd
                        (&this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>);
      if (qVar5 == 0) goto LAB_0010cfd5;
      QWindowSystemInterface::TouchPoint::TouchPoint
                ((this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr +
                 (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).size,args);
LAB_0010d0ec:
      pqVar2 = &(this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0010d0a5;
    }
LAB_0010cfd5:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QWindowSystemInterface::TouchPoint>::freeSpaceAtBegin
                        (&this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>);
      if (qVar5 != 0) {
        QWindowSystemInterface::TouchPoint::TouchPoint
                  ((this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr + -1,args
                  );
        ppTVar1 = &(this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr;
        *ppTVar1 = *ppTVar1 + -1;
        goto LAB_0010d0ec;
      }
    }
  }
  puVar7 = &DAT_0010f528;
  pTVar8 = &tmp;
  for (lVar6 = 0xf; lVar6 != 0; lVar6 = lVar6 + -1) {
    *(undefined8 *)pTVar8 = *puVar7;
    puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
    pTVar8 = (TouchPoint *)((long)pTVar8 + (ulong)bVar10 * -0x10 + 8);
  }
  QWindowSystemInterface::TouchPoint::TouchPoint(&tmp,args);
  bVar9 = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).size != 0;
  QArrayDataPointer<QWindowSystemInterface::TouchPoint>::detachAndGrow
            (&this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>,
             (uint)(i == 0 && bVar9),1,(TouchPoint **)0x0,
             (QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)0x0);
  if (i == 0 && bVar9) {
    QWindowSystemInterface::TouchPoint::TouchPoint
              ((this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr + -1,&tmp);
    ppTVar1 = &(this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr;
    *ppTVar1 = *ppTVar1 + -1;
    pqVar2 = &(this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    local_f0.sourceCopyConstruct = 0;
    local_f0.nSource = 0;
    local_f0.move = 0;
    local_f0.sourceCopyAssign = 0;
    local_f0.end = (TouchPoint *)0x0;
    local_f0.last = (TouchPoint *)0x0;
    local_f0.where = (TouchPoint *)0x0;
    local_f0.begin = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr;
    local_f0.size = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).size;
    local_f0.data = &this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>;
    Inserter::insertOne(&local_f0,i,&tmp);
    (local_f0.data)->ptr = local_f0.begin;
    (local_f0.data)->size = local_f0.size;
  }
  QArrayDataPointer<QPointF>::~QArrayDataPointer(&tmp.rawPositions.d);
LAB_0010d0a5:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }